

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerListener
          (RegistryHub *this,unique_ptr<Catch::EventListenerFactory> *factory)

{
  unique_ptr<Catch::EventListenerFactory> *factory_00;
  unique_ptr<Catch::EventListenerFactory> *in_RSI;
  long in_RDI;
  ReporterRegistry *this_00;
  ReporterRegistry local_18 [3];
  
  factory_00 = (unique_ptr<Catch::EventListenerFactory> *)(in_RDI + 0x98);
  this_00 = local_18;
  Detail::unique_ptr<Catch::EventListenerFactory>::unique_ptr
            ((unique_ptr<Catch::EventListenerFactory> *)this_00,in_RSI);
  ReporterRegistry::registerListener(this_00,factory_00);
  Detail::unique_ptr<Catch::EventListenerFactory>::~unique_ptr
            ((unique_ptr<Catch::EventListenerFactory> *)this_00);
  return;
}

Assistant:

void registerListener( Detail::unique_ptr<EventListenerFactory> factory ) override {
                m_reporterRegistry.registerListener( CATCH_MOVE(factory) );
            }